

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O3

void __thiscall FIX::SessionNotFound::SessionNotFound(SessionNotFound *this,string *what)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Session Not Found","");
  FIX::Exception::Exception(&this->super_Exception,&local_40,what);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_001f6228;
  return;
}

Assistant:

SessionNotFound(const std::string &what = "")
      : Exception("Session Not Found", what) {}